

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::diffBasisSupported<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,int *point,double *x,double *diff_values,bool *isSupported)

{
  bool bVar1;
  int j;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int k;
  long lVar7;
  double dVar8;
  bool isDimSupported;
  double *local_38;
  
  *isSupported = false;
  uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    diff_values[uVar4] = 1.0;
  }
  isDimSupported = false;
  lVar6 = 1;
  local_38 = x;
  for (lVar7 = 0; lVar7 < (int)uVar2; lVar7 = lVar7 + 1) {
    dVar8 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)4>
                      (this->order,point[lVar7],local_38[lVar7],&isDimSupported);
    bVar1 = *isSupported;
    if (isDimSupported != false) {
      bVar1 = true;
    }
    *isSupported = bVar1;
    for (lVar3 = 0; lVar7 != lVar3; lVar3 = lVar3 + 1) {
      diff_values[lVar3] = diff_values[lVar3] * dVar8;
    }
    uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
    for (lVar3 = lVar6; (int)lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
      diff_values[lVar3] = diff_values[lVar3] * dVar8;
    }
    lVar6 = lVar6 + 1;
  }
  for (lVar6 = 0; lVar6 < (int)uVar2; lVar6 = lVar6 + 1) {
    dVar8 = RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)4>
                      (this->order,point[lVar6],local_38[lVar6],&isDimSupported);
    diff_values[lVar6] = dVar8 * diff_values[lVar6];
    bVar1 = *isSupported;
    if (isDimSupported != false) {
      bVar1 = true;
    }
    *isSupported = bVar1;
    uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  }
  return;
}

Assistant:

void diffBasisSupported(const int point[], const double x[], double diff_values[], bool &isSupported) const{
        isSupported = false;
        for(int i=0; i<num_dimensions; i++) diff_values[i] = 1.0;
        bool isDimSupported = false;
        for(int k=0; k<num_dimensions; k++) {
            double fval = RuleLocal::evalSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
            for(int j=0; j<k; j++) diff_values[j] *= fval;
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= fval;
        }
        for (int k=0; k<num_dimensions; k++) {
            diff_values[k] *= RuleLocal::diffSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
        }
    }